

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_EBMultiFabUtil.cpp
# Opt level: O0

void amrex::EB_average_down_faces
               (Array<const_MultiFab_*,_3> *fine,Array<MultiFab_*,_3> *crse,IntVect *ratio,
               Geometry *crse_geom)

{
  bool bVar1;
  const_reference ppMVar2;
  const_reference ppMVar3;
  reference pvVar4;
  undefined8 in_RDI;
  int idim_1;
  BoxArray cba;
  int idim;
  Array<MultiFab,_3> ctmp;
  int ncomp;
  int ngcrse;
  FabArray<amrex::FArrayBox> *in_stack_fffffffffffffa08;
  BoxArray *in_stack_fffffffffffffa10;
  Geometry *in_stack_fffffffffffffa18;
  FabArray<amrex::FArrayBox> *in_stack_fffffffffffffa20;
  undefined4 in_stack_fffffffffffffa28;
  undefined4 in_stack_fffffffffffffa2c;
  uint num_comp;
  Array<const_MultiFab_*,_3> *in_stack_fffffffffffffa30;
  undefined8 uVar5;
  FabArray<amrex::FArrayBox> *src;
  FabArray<amrex::FArrayBox> *in_stack_fffffffffffffa40;
  DistributionMapping *in_stack_fffffffffffffa50;
  uint in_stack_fffffffffffffa58;
  uint in_stack_fffffffffffffa5c;
  int local_57c;
  undefined1 local_578 [32];
  undefined8 local_558 [8];
  undefined1 local_518 [108];
  int local_4ac;
  uint local_28;
  uint local_24;
  undefined8 local_8;
  
  local_8 = in_RDI;
  std::array<const_amrex::MultiFab_*,_3UL>::operator[]
            ((array<const_amrex::MultiFab_*,_3UL> *)in_stack_fffffffffffffa10,
             (size_type)in_stack_fffffffffffffa08);
  bVar1 = FabArray<amrex::FArrayBox>::hasEBFabFactory(in_stack_fffffffffffffa20);
  if (bVar1) {
    local_24 = 0;
    ppMVar2 = std::array<amrex::MultiFab_*,_3UL>::operator[]
                        ((array<amrex::MultiFab_*,_3UL> *)in_stack_fffffffffffffa10,
                         (size_type)in_stack_fffffffffffffa08);
    local_28 = FabArrayBase::nComp((FabArrayBase *)*ppMVar2);
    std::array<amrex::MultiFab,_3UL>::array
              ((array<amrex::MultiFab,_3UL> *)in_stack_fffffffffffffa20);
    for (local_4ac = 0; local_4ac < 3; local_4ac = local_4ac + 1) {
      ppMVar3 = std::array<const_amrex::MultiFab_*,_3UL>::operator[]
                          ((array<const_amrex::MultiFab_*,_3UL> *)in_stack_fffffffffffffa10,
                           (size_type)in_stack_fffffffffffffa08);
      FabArrayBase::boxArray((FabArrayBase *)*ppMVar3);
      BoxArray::BoxArray(in_stack_fffffffffffffa10,(BoxArray *)in_stack_fffffffffffffa08);
      BoxArray::coarsen((BoxArray *)CONCAT44(in_stack_fffffffffffffa5c,in_stack_fffffffffffffa58),
                        (IntVect *)in_stack_fffffffffffffa50);
      pvVar4 = std::array<amrex::MultiFab,_3UL>::operator[]
                         ((array<amrex::MultiFab,_3UL> *)in_stack_fffffffffffffa10,
                          (size_type)in_stack_fffffffffffffa08);
      ppMVar3 = std::array<const_amrex::MultiFab_*,_3UL>::operator[]
                          ((array<const_amrex::MultiFab_*,_3UL> *)in_stack_fffffffffffffa10,
                           (size_type)in_stack_fffffffffffffa08);
      in_stack_fffffffffffffa50 = FabArrayBase::DistributionMap((FabArrayBase *)*ppMVar3);
      local_558[2] = 0;
      local_558[3] = 0;
      local_558[0] = 0;
      local_558[1] = 0;
      local_558[4] = 0;
      in_stack_fffffffffffffa58 = local_28;
      in_stack_fffffffffffffa5c = local_24;
      MFInfo::MFInfo((MFInfo *)0x13ecf98);
      local_578._24_8_ = 0;
      in_stack_fffffffffffffa08 = (FabArray<amrex::FArrayBox> *)(local_578 + 0x18);
      DefaultFabFactory<amrex::FArrayBox>::DefaultFabFactory
                ((DefaultFabFactory<amrex::FArrayBox> *)in_stack_fffffffffffffa10);
      in_stack_fffffffffffffa40 = in_stack_fffffffffffffa08;
      (*(pvVar4->super_FabArray<amrex::FArrayBox>).super_FabArrayBase._vptr_FabArrayBase[2])
                (pvVar4,local_518,in_stack_fffffffffffffa50,(ulong)in_stack_fffffffffffffa58,
                 (ulong)in_stack_fffffffffffffa5c,local_558);
      DefaultFabFactory<amrex::FArrayBox>::~DefaultFabFactory
                ((DefaultFabFactory<amrex::FArrayBox> *)0x13ecff9);
      MFInfo::~MFInfo((MFInfo *)0x13ed006);
      BoxArray::~BoxArray(in_stack_fffffffffffffa10);
    }
    src = (FabArray<amrex::FArrayBox> *)local_578;
    GetArrOfPtrs<amrex::MultiFab,amrex::FabArray<amrex::FArrayBox>::FABType>
              ((array<amrex::MultiFab,_3UL> *)in_stack_fffffffffffffa10);
    EB_average_down_faces
              ((Array<const_MultiFab_*,_3> *)
               ctmp._M_elems[1].super_FabArray<amrex::FArrayBox>.super_FabArrayBase.indexArray.
               super_vector<int,_std::allocator<int>_>.super__Vector_base<int,_std::allocator<int>_>
               ._M_impl.super__Vector_impl_data._M_finish,
               (Array<MultiFab_*,_3> *)
               ctmp._M_elems[1].super_FabArray<amrex::FArrayBox>.super_FabArrayBase.indexArray.
               super_vector<int,_std::allocator<int>_>.super__Vector_base<int,_std::allocator<int>_>
               ._M_impl.super__Vector_impl_data._M_start,
               (IntVect *)
               ctmp._M_elems[1].super_FabArray<amrex::FArrayBox>.super_FabArrayBase.distributionMap.
               m_ref.super___shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi,
               ctmp._M_elems[1].super_FabArray<amrex::FArrayBox>.super_FabArrayBase.distributionMap.
               m_ref.super___shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr._4_4_);
    uVar5 = local_8;
    for (local_57c = 0; local_57c < 3; local_57c = local_57c + 1) {
      std::array<amrex::MultiFab_*,_3UL>::operator[]
                ((array<amrex::MultiFab_*,_3UL> *)in_stack_fffffffffffffa10,
                 (size_type)in_stack_fffffffffffffa08);
      in_stack_fffffffffffffa20 =
           &std::array<amrex::MultiFab,_3UL>::operator[]
                      ((array<amrex::MultiFab,_3UL> *)in_stack_fffffffffffffa10,
                       (size_type)in_stack_fffffffffffffa08)->super_FabArray<amrex::FArrayBox>;
      num_comp = local_28;
      Geometry::periodicity((Geometry *)in_stack_fffffffffffffa40);
      in_stack_fffffffffffffa08 =
           (FabArray<amrex::FArrayBox> *)((ulong)in_stack_fffffffffffffa08 & 0xffffffff00000000);
      FabArray<amrex::FArrayBox>::ParallelCopy
                (in_stack_fffffffffffffa40,src,(int)((ulong)uVar5 >> 0x20),(int)uVar5,num_comp,
                 (Periodicity *)in_stack_fffffffffffffa20,(CpOp)in_stack_fffffffffffffa50);
    }
    std::array<amrex::MultiFab,_3UL>::~array
              ((array<amrex::MultiFab,_3UL> *)in_stack_fffffffffffffa20);
  }
  else {
    average_down_faces(in_stack_fffffffffffffa30,
                       (Array<MultiFab_*,_3> *)
                       CONCAT44(in_stack_fffffffffffffa2c,in_stack_fffffffffffffa28),
                       (IntVect *)in_stack_fffffffffffffa20,in_stack_fffffffffffffa18);
  }
  return;
}

Assistant:

void EB_average_down_faces (const Array<const MultiFab*,AMREX_SPACEDIM>& fine,
                            const Array<MultiFab*,AMREX_SPACEDIM>& crse,
                            const IntVect& ratio, const Geometry& crse_geom)
{
    AMREX_ASSERT(crse[0]->nComp() == fine[0]->nComp());

    if (!(*fine[0]).hasEBFabFactory())
    {
        amrex::average_down_faces(fine, crse, ratio, crse_geom);
    }
    else
    {
        int ngcrse = 0;
        int ncomp = crse[0]->nComp();
        Array<MultiFab,AMREX_SPACEDIM> ctmp;
        for (int idim = 0; idim < AMREX_SPACEDIM; ++idim)
        {
            BoxArray cba = fine[idim]->boxArray();
            cba.coarsen(ratio);
            ctmp[idim].define(cba, fine[idim]->DistributionMap(), ncomp, ngcrse, MFInfo(), FArrayBoxFactory());
        }
        EB_average_down_faces(fine, amrex::GetArrOfPtrs(ctmp), ratio, ngcrse);
        for (int idim = 0; idim < AMREX_SPACEDIM; ++idim)
        {
            crse[idim]->ParallelCopy(ctmp[idim],0,0,ncomp,crse_geom.periodicity());
        }
    }
}